

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int c1f5kf_(int *ido,int *l1,int *na,double *cc,int *in1,double *ch,int *in2,double *wa)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  uint uVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  int iVar18;
  double *pdVar19;
  ulong uVar20;
  double *pdVar21;
  uint uVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  int iVar26;
  ulong uVar27;
  double *pdVar28;
  double *pdVar29;
  double *pdVar30;
  uint uVar31;
  double *pdVar32;
  double *pdVar33;
  long lVar34;
  double *pdVar35;
  long lVar36;
  double *pdVar37;
  double *pdVar38;
  bool bVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double *local_110;
  
  uVar1 = *ido;
  uVar20 = (ulong)uVar1;
  iVar18 = uVar1 * 5 + 1;
  lVar36 = (long)*in1;
  uVar2 = *l1;
  lVar34 = (long)(int)uVar2;
  uVar31 = uVar2 * 6;
  uVar22 = uVar2 * (uVar1 + 1);
  lVar5 = (long)(int)(~uVar22 * *in1 + -1);
  lVar16 = (long)*in2;
  lVar6 = (long)(int)(~uVar31 * *in2 + -1);
  if ((int)uVar1 < 2) {
    dVar43 = 1.0 / (double)(int)(uVar2 * 5);
    iVar18 = iVar18 * uVar2;
    iVar26 = (uVar1 * 3 + 1) * uVar2;
    if (*na == 1) {
      uVar3 = 0;
      if (0 < (int)uVar2) {
        uVar3 = uVar2;
      }
      uVar20 = (ulong)uVar3;
      pdVar23 = cc + ((long)(int)((uVar1 * 2 + 1) * uVar2) + 1) * lVar36 + 2;
      pdVar13 = cc + ((long)iVar18 + 1) * lVar36 + 2;
      pdVar19 = cc + ((long)iVar26 + 1) * lVar36 + 2;
      pdVar8 = cc + ((long)(int)((uVar1 * 4 + 1) * uVar2) + 1) * lVar36 + 2;
      pdVar29 = cc + ((long)(int)uVar22 + 1) * lVar36 + 2;
      pdVar32 = ch + ((long)(int)uVar31 + 1) * lVar16 + 2;
      pdVar15 = ch + ((long)(int)(uVar2 * 7) + 1) * lVar16 + 2;
      pdVar24 = ch + ((long)(int)(uVar2 * 10) + 1) * lVar16 + 2;
      pdVar28 = ch + ((long)(int)(uVar2 * 8) + 1) * lVar16 + 1;
      pdVar10 = ch + ((long)(int)(uVar2 * 9) + 1) * lVar16 + 1;
      while (bVar39 = uVar20 != 0, uVar20 = uVar20 - 1, bVar39) {
        dVar51 = pdVar23[lVar5] - pdVar13[lVar5];
        dVar41 = pdVar23[lVar5] + pdVar13[lVar5];
        dVar50 = pdVar19[lVar5] - pdVar8[lVar5];
        dVar42 = pdVar19[lVar5] + pdVar8[lVar5];
        dVar53 = pdVar23[lVar5 + -1] - pdVar13[lVar5 + -1];
        dVar49 = pdVar23[lVar5 + -1] + pdVar13[lVar5 + -1];
        dVar52 = pdVar19[lVar5 + -1] - pdVar8[lVar5 + -1];
        dVar48 = pdVar19[lVar5 + -1] + pdVar8[lVar5 + -1];
        pdVar32[lVar6 + -1] = (pdVar29[lVar5 + -1] + dVar49 + dVar48) * dVar43;
        pdVar32[lVar6] = (pdVar29[lVar5] + dVar41 + dVar42) * dVar43;
        dVar47 = pdVar29[lVar5 + -1];
        dVar40 = pdVar29[lVar5];
        dVar45 = dVar48 * -0.8090169943749475 + dVar49 * 0.3090169943749474 + dVar47;
        dVar44 = dVar42 * -0.8090169943749475 + dVar41 * 0.3090169943749474 + dVar40;
        dVar54 = dVar53 * -0.9510565162951536 + dVar52 * -0.5877852522924731;
        dVar46 = dVar51 * -0.9510565162951536 + dVar50 * -0.5877852522924731;
        pdVar15[lVar6 + -1] = (dVar45 - dVar46) * dVar43;
        pdVar24[lVar6 + -1] = (dVar46 + dVar45) * dVar43;
        pdVar15[lVar6] = (dVar54 + dVar44) * dVar43;
        dVar47 = dVar48 * 0.3090169943749474 + dVar49 * -0.8090169943749475 + dVar47;
        dVar45 = dVar53 * -0.5877852522924731 + dVar52 * 0.9510565162951536;
        dVar46 = dVar51 * -0.5877852522924731 + dVar50 * 0.9510565162951536;
        dVar40 = dVar42 * 0.3090169943749474 + dVar41 * -0.8090169943749475 + dVar40;
        pdVar28[lVar6] = (dVar47 - dVar46) * dVar43;
        (pdVar28 + lVar6)[1] = (dVar45 + dVar40) * dVar43;
        pdVar10[lVar6] = (dVar47 + dVar46) * dVar43;
        (pdVar10 + lVar6)[1] = (dVar40 - dVar45) * dVar43;
        pdVar24[lVar6] = (dVar44 - dVar54) * dVar43;
        pdVar23 = pdVar23 + lVar36;
        pdVar13 = pdVar13 + lVar36;
        pdVar19 = pdVar19 + lVar36;
        pdVar8 = pdVar8 + lVar36;
        pdVar29 = pdVar29 + lVar36;
        pdVar32 = pdVar32 + lVar16;
        pdVar15 = pdVar15 + lVar16;
        pdVar24 = pdVar24 + lVar16;
        pdVar28 = pdVar28 + lVar16;
        pdVar10 = pdVar10 + lVar16;
      }
    }
    else {
      uVar20 = 0;
      if (0 < (int)uVar2) {
        uVar20 = (ulong)uVar2;
      }
      pdVar10 = cc + ((long)(int)((uVar1 * 2 + 1) * uVar2) + 1) * lVar36 + 1;
      pdVar13 = cc + ((long)iVar18 + 1) * lVar36 + 1;
      pdVar15 = cc + ((long)iVar26 + 1) * lVar36 + 1;
      pdVar19 = cc + ((long)(int)((uVar1 * 4 + 1) * uVar2) + 1) * lVar36 + 1;
      pdVar23 = cc + ((long)(int)uVar22 + 1) * lVar36 + 1;
      while (bVar39 = uVar20 != 0, uVar20 = uVar20 - 1, bVar39) {
        dVar47 = pdVar10[lVar5];
        dVar40 = (pdVar10 + lVar5)[1];
        dVar41 = pdVar13[lVar5];
        dVar42 = (pdVar13 + lVar5)[1];
        dVar49 = dVar47 - dVar41;
        dVar50 = dVar40 - dVar42;
        dVar44 = pdVar15[lVar5];
        dVar45 = (pdVar15 + lVar5)[1];
        dVar46 = pdVar19[lVar5];
        dVar48 = (pdVar19 + lVar5)[1];
        dVar51 = dVar44 - dVar46;
        dVar52 = dVar45 - dVar48;
        dVar47 = dVar47 + dVar41;
        dVar40 = dVar40 + dVar42;
        dVar44 = dVar44 + dVar46;
        dVar45 = dVar45 + dVar48;
        dVar41 = pdVar23[lVar5];
        dVar42 = (pdVar23 + lVar5)[1];
        dVar54 = dVar44 * -0.8090169943749475 + dVar47 * 0.3090169943749474 + dVar41;
        dVar48 = dVar45 * -0.8090169943749475 + dVar40 * 0.3090169943749474 + dVar42;
        pdVar23[lVar5] = (dVar47 + dVar41 + dVar44) * dVar43;
        (pdVar23 + lVar5)[1] = (dVar40 + dVar42 + dVar45) * dVar43;
        dVar53 = dVar49 * -0.9510565162951536 + dVar51 * -0.5877852522924731;
        dVar46 = dVar50 * -0.9510565162951536 + dVar52 * -0.5877852522924731;
        pdVar10[lVar5] = (dVar54 - dVar46) * dVar43;
        pdVar13[lVar5] = (dVar46 + dVar54) * dVar43;
        pdVar10[lVar5 + 1] = (dVar53 + dVar48) * dVar43;
        dVar47 = dVar44 * 0.3090169943749474 + dVar47 * -0.8090169943749475 + dVar41;
        dVar41 = dVar49 * -0.5877852522924731 + dVar51 * 0.9510565162951536;
        dVar44 = dVar50 * -0.5877852522924731 + dVar52 * 0.9510565162951536;
        dVar40 = dVar45 * 0.3090169943749474 + dVar40 * -0.8090169943749475 + dVar42;
        pdVar15[lVar5] = (dVar47 - dVar44) * dVar43;
        (pdVar15 + lVar5)[1] = (dVar41 + dVar40) * dVar43;
        pdVar19[lVar5] = (dVar47 + dVar44) * dVar43;
        (pdVar19 + lVar5)[1] = (dVar40 - dVar41) * dVar43;
        pdVar13[lVar5 + 1] = (dVar48 - dVar53) * dVar43;
        pdVar10 = pdVar10 + lVar36;
        pdVar13 = pdVar13 + lVar36;
        pdVar15 = pdVar15 + lVar36;
        pdVar19 = pdVar19 + lVar36;
        pdVar23 = pdVar23 + lVar36;
      }
    }
  }
  else {
    uVar4 = uVar1 * 5;
    uVar12 = ~uVar4;
    uVar3 = 0;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    pdVar29 = cc + ((long)(int)((uVar1 * 2 + 1) * uVar2) + 1) * lVar36 + 2;
    pdVar13 = cc + ((long)(int)(iVar18 * uVar2) + 1) * lVar36 + 2;
    pdVar24 = cc + ((long)(int)((uVar1 * 3 + 1) * uVar2) + 1) * lVar36 + 2;
    pdVar28 = cc + ((long)(int)((uVar1 * 4 + 1) * uVar2) + 1) * lVar36 + 2;
    pdVar32 = cc + ((long)(int)uVar22 + 1) * lVar36 + 2;
    pdVar8 = ch + ((long)(int)uVar31 + 1) * lVar16 + 2;
    pdVar15 = ch + ((long)(int)(uVar2 * 7) + 1) * lVar16 + 2;
    pdVar10 = ch + ((long)(int)(uVar2 * 10) + 1) * lVar16 + 2;
    pdVar19 = ch + ((long)(int)(uVar2 * 8) + 1) * lVar16 + 1;
    pdVar23 = ch + ((long)(int)(uVar2 * 9) + 1) * lVar16 + 1;
    uVar27 = (ulong)uVar3;
    while (bVar39 = uVar27 != 0, uVar27 = uVar27 - 1, bVar39) {
      dVar46 = pdVar29[lVar5] - pdVar13[lVar5];
      dVar40 = pdVar29[lVar5] + pdVar13[lVar5];
      dVar45 = pdVar24[lVar5] - pdVar28[lVar5];
      dVar51 = pdVar24[lVar5] + pdVar28[lVar5];
      dVar49 = pdVar29[lVar5 + -1] - pdVar13[lVar5 + -1];
      dVar44 = pdVar29[lVar5 + -1] + pdVar13[lVar5 + -1];
      dVar48 = pdVar24[lVar5 + -1] - pdVar28[lVar5 + -1];
      dVar42 = pdVar24[lVar5 + -1] + pdVar28[lVar5 + -1];
      pdVar8[lVar6 + -1] = pdVar32[lVar5 + -1] + dVar44 + dVar42;
      pdVar8[lVar6] = pdVar32[lVar5] + dVar40 + dVar51;
      dVar43 = pdVar32[lVar5 + -1];
      dVar47 = pdVar32[lVar5];
      dVar53 = dVar42 * -0.8090169943749475 + dVar44 * 0.3090169943749474 + dVar43;
      dVar52 = dVar51 * -0.8090169943749475 + dVar40 * 0.3090169943749474 + dVar47;
      dVar50 = dVar49 * -0.9510565162951536 + dVar48 * -0.5877852522924731;
      dVar41 = dVar46 * -0.9510565162951536 + dVar45 * -0.5877852522924731;
      pdVar15[lVar6 + -1] = dVar53 - dVar41;
      pdVar10[lVar6 + -1] = dVar41 + dVar53;
      pdVar15[lVar6] = dVar50 + dVar52;
      dVar43 = dVar42 * 0.3090169943749474 + dVar44 * -0.8090169943749475 + dVar43;
      dVar41 = dVar49 * -0.5877852522924731 + dVar48 * 0.9510565162951536;
      dVar42 = dVar46 * -0.5877852522924731 + dVar45 * 0.9510565162951536;
      dVar47 = dVar51 * 0.3090169943749474 + dVar40 * -0.8090169943749475 + dVar47;
      pdVar19[lVar6] = dVar43 - dVar42;
      (pdVar19 + lVar6)[1] = dVar41 + dVar47;
      pdVar23[lVar6] = dVar43 + dVar42;
      (pdVar23 + lVar6)[1] = dVar47 - dVar41;
      pdVar10[lVar6] = dVar52 - dVar50;
      pdVar29 = pdVar29 + lVar36;
      pdVar13 = pdVar13 + lVar36;
      pdVar24 = pdVar24 + lVar36;
      pdVar28 = pdVar28 + lVar36;
      pdVar32 = pdVar32 + lVar36;
      pdVar8 = pdVar8 + lVar16;
      pdVar15 = pdVar15 + lVar16;
      pdVar10 = pdVar10 + lVar16;
      pdVar19 = pdVar19 + lVar16;
      pdVar23 = pdVar23 + lVar16;
    }
    lVar7 = lVar34 * lVar36;
    pdVar24 = cc + (((long)(int)(uVar1 * 2) + 2) * lVar34 + 1) * lVar36 + 2;
    pdVar10 = cc + (((ulong)uVar4 + 2) * lVar34 + 1) * lVar36 + 2;
    pdVar13 = cc + (((ulong)(uVar1 * 3) + 2) * lVar34 + 1) * lVar36 + 2;
    pdVar15 = cc + (((long)(int)(uVar1 * 4) + 2) * lVar34 + 1) * lVar36 + 2;
    pdVar8 = cc + ((uVar20 + 2) * lVar34 + 1) * lVar36 + 2;
    lVar11 = lVar34 * lVar16;
    pdVar28 = ch + (lVar34 * 0xb + 1) * lVar16 + 2;
    pdVar19 = ch + (lVar34 * 0xc + 1) * lVar16 + 2;
    pdVar23 = ch + (lVar34 * 0xd + 1) * lVar16 + 2;
    pdVar29 = ch + (lVar34 * 0xe + 1) * lVar16 + 2;
    pdVar32 = ch + (lVar34 * 0xf + 1) * lVar16 + 2;
    for (uVar27 = 2; uVar27 != uVar1 + 1; uVar27 = uVar27 + 1) {
      lVar34 = uVar4 + uVar27;
      uVar9 = (ulong)uVar3;
      pdVar14 = pdVar29;
      pdVar17 = pdVar32;
      pdVar21 = pdVar13;
      pdVar25 = pdVar24;
      pdVar30 = pdVar8;
      pdVar33 = pdVar15;
      pdVar35 = pdVar23;
      pdVar37 = pdVar28;
      pdVar38 = pdVar10;
      local_110 = pdVar19;
      while (bVar39 = uVar9 != 0, uVar9 = uVar9 - 1, bVar39) {
        dVar47 = pdVar25[lVar5] - pdVar38[lVar5];
        dVar41 = pdVar25[lVar5] + pdVar38[lVar5];
        dVar46 = pdVar21[lVar5] - pdVar33[lVar5];
        dVar43 = pdVar21[lVar5] + pdVar33[lVar5];
        dVar44 = pdVar25[lVar5 + -1] - pdVar38[lVar5 + -1];
        dVar42 = pdVar25[lVar5 + -1] + pdVar38[lVar5 + -1];
        dVar49 = pdVar21[lVar5 + -1] - pdVar33[lVar5 + -1];
        dVar40 = pdVar21[lVar5 + -1] + pdVar33[lVar5 + -1];
        pdVar37[lVar6 + -1] = pdVar30[lVar5 + -1] + dVar42 + dVar40;
        pdVar37[lVar6] = pdVar30[lVar5] + dVar41 + dVar43;
        dVar45 = dVar40 * -0.8090169943749475 + dVar42 * 0.3090169943749474 + pdVar30[lVar5 + -1];
        dVar50 = dVar43 * -0.8090169943749475 + dVar41 * 0.3090169943749474 + pdVar30[lVar5];
        dVar42 = dVar40 * 0.3090169943749474 + dVar42 * -0.8090169943749475 + pdVar30[lVar5 + -1];
        dVar41 = dVar43 * 0.3090169943749474 + dVar41 * -0.8090169943749475 + pdVar30[lVar5];
        dVar43 = dVar44 * -0.9510565162951536 + dVar49 * -0.5877852522924731;
        dVar48 = dVar47 * -0.9510565162951536 + dVar46 * -0.5877852522924731;
        dVar44 = dVar44 * -0.5877852522924731 + dVar49 * 0.9510565162951536;
        dVar40 = dVar47 * -0.5877852522924731 + dVar46 * 0.9510565162951536;
        dVar47 = dVar42 - dVar40;
        dVar40 = dVar40 + dVar42;
        dVar46 = dVar44 + dVar41;
        dVar41 = dVar41 - dVar44;
        dVar42 = dVar48 + dVar45;
        dVar45 = dVar45 - dVar48;
        dVar44 = dVar50 - dVar43;
        dVar43 = dVar43 + dVar50;
        local_110[lVar6 + -1] =
             wa[(int)uVar12 + lVar34] * dVar45 +
             wa[(long)(int)uVar12 + uVar20 * 9 + uVar27] * dVar43;
        local_110[lVar6] =
             dVar43 * wa[(int)uVar12 + lVar34] -
             dVar45 * wa[(long)(int)uVar12 + uVar20 * 9 + uVar27];
        pdVar35[lVar6 + -1] =
             wa[(long)(int)uVar12 + uVar20 * 6 + uVar27] * dVar47 +
             wa[(long)(int)uVar12 + uVar20 * 10 + uVar27] * dVar46;
        pdVar35[lVar6] =
             dVar46 * wa[(long)(int)uVar12 + uVar20 * 6 + uVar27] -
             dVar47 * wa[(long)(int)uVar12 + uVar20 * 10 + uVar27];
        pdVar14[lVar6 + -1] =
             wa[(long)(int)uVar12 + uVar20 * 7 + uVar27] * dVar40 +
             wa[(long)(int)uVar12 + uVar20 * 0xb + uVar27] * dVar41;
        pdVar14[lVar6] =
             dVar41 * wa[(long)(int)uVar12 + uVar20 * 7 + uVar27] -
             dVar40 * wa[(long)(int)uVar12 + uVar20 * 0xb + uVar27];
        pdVar17[lVar6 + -1] =
             wa[(long)(int)uVar12 + (long)(int)(uVar1 * 8) + uVar27] * dVar42 +
             wa[(long)(int)uVar12 + uVar20 * 0xc + uVar27] * dVar44;
        pdVar17[lVar6] =
             dVar44 * wa[(long)(int)uVar12 + (long)(int)(uVar1 * 8) + uVar27] -
             dVar42 * wa[(long)(int)uVar12 + uVar20 * 0xc + uVar27];
        pdVar25 = pdVar25 + lVar36;
        pdVar38 = pdVar38 + lVar36;
        pdVar21 = pdVar21 + lVar36;
        pdVar33 = pdVar33 + lVar36;
        pdVar30 = pdVar30 + lVar36;
        pdVar37 = pdVar37 + lVar16;
        local_110 = local_110 + lVar16;
        pdVar35 = pdVar35 + lVar16;
        pdVar14 = pdVar14 + lVar16;
        pdVar17 = pdVar17 + lVar16;
      }
      pdVar24 = pdVar24 + lVar7;
      pdVar10 = pdVar10 + lVar7;
      pdVar13 = pdVar13 + lVar7;
      pdVar15 = pdVar15 + lVar7;
      pdVar8 = pdVar8 + lVar7;
      pdVar28 = pdVar28 + lVar11 * 5;
      pdVar19 = pdVar19 + lVar11 * 5;
      pdVar23 = pdVar23 + lVar11 * 5;
      pdVar29 = pdVar29 + lVar11 * 5;
      pdVar32 = pdVar32 + lVar11 * 5;
    }
  }
  return 0;
}

Assistant:

int c1f5kf_(int *ido, int *l1, int *na, fft_real_t *cc,
	 int *in1, fft_real_t *ch, int *in2, fft_real_t *wa)
{
    /* Initialized data */

     fft_real_t tr11 = .3090169943749474;
     fft_real_t ti11 = -.9510565162951536;
     fft_real_t tr12 = -.8090169943749474;
     fft_real_t ti12 = -.5877852522924731;

    /* System generated locals */
    int cc_dim1, cc_dim2, cc_dim3, cc_offset, ch_dim1, ch_dim2, ch_offset,
	     wa_dim1, wa_offset, i__1, i__2;

    /* Local variables */
     int i__, k;
     fft_real_t sn, ci2, ci3, ci4, ci5, di3, di4, di5, di2, cr2, cr3, cr5,
	    cr4, dr3, dr4, ti2, ti3, ti4, ti5, dr5, dr2, tr2, tr3, tr4, tr5,
	    chold1, chold2;

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_offset = 1 + wa_dim1 * 5;
    wa -= wa_offset;
    cc_dim1 = *in1;
    cc_dim2 = *l1;
    cc_dim3 = *ido;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch_dim1 = *in2;
    ch_dim2 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * 6);
    ch -= ch_offset;

    /* Function Body */

/* FFTPACK 5.1 auxiliary routine */

    if (*ido > 1) {
	goto L102;
    }
    sn = 1.0 / (fft_real_t) (*l1 * 5);
    if (*na == 1) {
	goto L106;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ti5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	ti3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	tr5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	tr3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	chold1 = sn * (cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr2
		+ tr3);
	chold2 = sn * (cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + ti2
		+ ti3);
	cr2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr11 * tr2 +
		tr12 * tr3;
	ci2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr11 * ti2 +
		tr12 * ti3;
	cr3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr12 * tr2 +
		tr11 * tr3;
	ci3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr12 * ti2 +
		tr11 * ti3;
	cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = chold1;
	cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] = chold2;
	cr5 = ti11 * tr5 + ti12 * tr4;
	ci5 = ti11 * ti5 + ti12 * ti4;
	cr4 = ti12 * tr5 - ti11 * tr4;
	ci4 = ti12 * ti5 - ti11 * ti4;
	cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] = sn * (cr2 -
		ci5);
	cc[(k + (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1] = sn * (cr2 + ci5)
		;
	cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] = sn * (ci2 +
		cr5);
	cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] = sn * (ci3 + cr4)
		;
	cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] = sn * (cr3 - ci4)
		;
	cc[(k + ((cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1] = sn * (cr3 +
		ci4);
	cc[(k + ((cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2] = sn * (ci3 -
		cr4);
	cc[(k + (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2] = sn * (ci2 - cr5)
		;
/* L101: */
    }
    return 0;
L106:
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ti5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	ti3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	tr5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	tr3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	ch[(k + ch_dim2 * 6) * ch_dim1 + 1] = sn * (cc[(k + (cc_dim3 + 1) *
		cc_dim2) * cc_dim1 + 1] + tr2 + tr3);
	ch[(k + ch_dim2 * 6) * ch_dim1 + 2] = sn * (cc[(k + (cc_dim3 + 1) *
		cc_dim2) * cc_dim1 + 2] + ti2 + ti3);
	cr2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr11 * tr2 +
		tr12 * tr3;
	ci2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr11 * ti2 +
		tr12 * ti3;
	cr3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr12 * tr2 +
		tr11 * tr3;
	ci3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr12 * ti2 +
		tr11 * ti3;
	cr5 = ti11 * tr5 + ti12 * tr4;
	ci5 = ti11 * ti5 + ti12 * ti4;
	cr4 = ti12 * tr5 - ti11 * tr4;
	ci4 = ti12 * ti5 - ti11 * ti4;
	ch[(k + ch_dim2 * 7) * ch_dim1 + 1] = sn * (cr2 - ci5);
	ch[(k + ch_dim2 * 10) * ch_dim1 + 1] = sn * (cr2 + ci5);
	ch[(k + ch_dim2 * 7) * ch_dim1 + 2] = sn * (ci2 + cr5);
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 2] = sn * (ci3 + cr4);
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 1] = sn * (cr3 - ci4);
	ch[(k + ch_dim2 * 9) * ch_dim1 + 1] = sn * (cr3 + ci4);
	ch[(k + ch_dim2 * 9) * ch_dim1 + 2] = sn * (ci3 - cr4);
	ch[(k + ch_dim2 * 10) * ch_dim1 + 2] = sn * (ci2 - cr5);
/* L107: */
    }
    return 0;
L102:
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ti5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	ti3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	tr5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	tr3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	ch[(k + ch_dim2 * 6) * ch_dim1 + 1] = cc[(k + (cc_dim3 + 1) * cc_dim2)
		 * cc_dim1 + 1] + tr2 + tr3;
	ch[(k + ch_dim2 * 6) * ch_dim1 + 2] = cc[(k + (cc_dim3 + 1) * cc_dim2)
		 * cc_dim1 + 2] + ti2 + ti3;
	cr2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr11 * tr2 +
		tr12 * tr3;
	ci2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr11 * ti2 +
		tr12 * ti3;
	cr3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr12 * tr2 +
		tr11 * tr3;
	ci3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr12 * ti2 +
		tr11 * ti3;
	cr5 = ti11 * tr5 + ti12 * tr4;
	ci5 = ti11 * ti5 + ti12 * ti4;
	cr4 = ti12 * tr5 - ti11 * tr4;
	ci4 = ti12 * ti5 - ti11 * ti4;
	ch[(k + ch_dim2 * 7) * ch_dim1 + 1] = cr2 - ci5;
	ch[(k + ch_dim2 * 10) * ch_dim1 + 1] = cr2 + ci5;
	ch[(k + ch_dim2 * 7) * ch_dim1 + 2] = ci2 + cr5;
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 2] = ci3 + cr4;
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 1] = cr3 - ci4;
	ch[(k + ch_dim2 * 9) * ch_dim1 + 1] = cr3 + ci4;
	ch[(k + ch_dim2 * 9) * ch_dim1 + 2] = ci3 - cr4;
	ch[(k + ch_dim2 * 10) * ch_dim1 + 2] = ci2 - cr5;
/* L103: */
    }
    i__1 = *ido;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ti5 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 2] -
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 2];
	    ti2 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 2] +
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 2];
	    ti4 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 2] - cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 2];
	    ti3 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 2] + cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 2];
	    tr5 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] -
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1];
	    tr2 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] +
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1];
	    tr4 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1];
	    tr3 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1];
	    ch[(k + (i__ * 5 + 1) * ch_dim2) * ch_dim1 + 1] = cc[(k + (i__ +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr2 + tr3;
	    ch[(k + (i__ * 5 + 1) * ch_dim2) * ch_dim1 + 2] = cc[(k + (i__ +
		    cc_dim3) * cc_dim2) * cc_dim1 + 2] + ti2 + ti3;
	    cr2 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 *
		    tr2 + tr12 * tr3;
	    ci2 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 2] + tr11 *
		    ti2 + tr12 * ti3;
	    cr3 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 *
		    tr2 + tr11 * tr3;
	    ci3 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 2] + tr12 *
		    ti2 + tr11 * ti3;
	    cr5 = ti11 * tr5 + ti12 * tr4;
	    ci5 = ti11 * ti5 + ti12 * ti4;
	    cr4 = ti12 * tr5 - ti11 * tr4;
	    ci4 = ti12 * ti5 - ti11 * ti4;
	    dr3 = cr3 - ci4;
	    dr4 = cr3 + ci4;
	    di3 = ci3 + cr4;
	    di4 = ci3 - cr4;
	    dr5 = cr2 + ci5;
	    dr2 = cr2 - ci5;
	    di5 = ci2 - cr5;
	    di2 = ci2 + cr5;
	    ch[(k + (i__ * 5 + 2) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 5] * dr2 + wa[i__ + wa_dim1 * 9] * di2;
	    ch[(k + (i__ * 5 + 2) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 5] * di2 - wa[i__ + wa_dim1 * 9] * dr2;
	    ch[(k + (i__ * 5 + 3) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 6] * dr3 + wa[i__ + wa_dim1 * 10] * di3;
	    ch[(k + (i__ * 5 + 3) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 6] * di3 - wa[i__ + wa_dim1 * 10] * dr3;
	    ch[(k + (i__ * 5 + 4) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 7] * dr4 + wa[i__ + wa_dim1 * 11] * di4;
	    ch[(k + (i__ * 5 + 4) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 7] * di4 - wa[i__ + wa_dim1 * 11] * dr4;
	    ch[(k + (i__ * 5 + 5) * ch_dim2) * ch_dim1 + 1] = wa[i__ + (
		    wa_dim1 << 3)] * dr5 + wa[i__ + wa_dim1 * 12] * di5;
	    ch[(k + (i__ * 5 + 5) * ch_dim2) * ch_dim1 + 2] = wa[i__ + (
		    wa_dim1 << 3)] * di5 - wa[i__ + wa_dim1 * 12] * dr5;
/* L104: */
	}
/* L105: */
    }
    return 0;
}